

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O0

int EVP_tls_cbc_digest_record
              (EVP_MD *md,uint8_t *md_out,size_t *md_out_size,uint8_t *header,uint8_t *data,
              size_t data_size,size_t data_plus_mac_plus_padding_size,uint8_t *mac_secret,
              uint mac_secret_length)

{
  int iVar1;
  size_t data_size_local;
  uint8_t *data_local;
  uint8_t *header_local;
  size_t *md_out_size_local;
  uint8_t *md_out_local;
  EVP_MD *md_local;
  
  iVar1 = EVP_MD_type((EVP_MD *)md);
  if (iVar1 == 0x40) {
    md_local._4_4_ =
         tls_cbc_digest_record_sha1
                   (md_out,md_out_size,header,data,data_size,data_plus_mac_plus_padding_size,
                    mac_secret,mac_secret_length);
  }
  else {
    if (iVar1 != 0x2a0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                    ,0x1d8,
                    "int EVP_tls_cbc_digest_record(const EVP_MD *, uint8_t *, size_t *, const uint8_t *, const uint8_t *, size_t, size_t, const uint8_t *, unsigned int)"
                   );
    }
    md_local._4_4_ =
         tls_cbc_digest_record_sha256
                   (md_out,md_out_size,header,data,data_size,data_plus_mac_plus_padding_size,
                    mac_secret,mac_secret_length);
  }
  return md_local._4_4_;
}

Assistant:

int EVP_tls_cbc_digest_record(const EVP_MD *md, uint8_t *md_out,
                              size_t *md_out_size, const uint8_t header[13],
                              const uint8_t *data, size_t data_size,
                              size_t data_plus_mac_plus_padding_size,
                              const uint8_t *mac_secret,
                              unsigned mac_secret_length) {
  switch (EVP_MD_type(md)) {
    case NID_sha1:
      return tls_cbc_digest_record_sha1(
          md_out, md_out_size, header, data, data_size,
          data_plus_mac_plus_padding_size, mac_secret, mac_secret_length);

    case NID_sha256:
      return tls_cbc_digest_record_sha256(
          md_out, md_out_size, header, data, data_size,
          data_plus_mac_plus_padding_size, mac_secret, mac_secret_length);

    default:
      // EVP_tls_cbc_record_digest_supported should have been called first to
      // check that the hash function is supported.
      assert(0);
      *md_out_size = 0;
      return 0;
  }
}